

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib510.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  long lVar2;
  undefined4 local_34;
  long lStack_30;
  WriteThis pooh;
  curl_slist *slist;
  CURLcode res;
  CURL *curl;
  char *URL_local;
  
  lStack_30 = 0;
  local_34 = 0;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 == 0) {
      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
      curl_global_cleanup();
      URL_local._4_4_ = 0x7e;
    }
    else {
      lStack_30 = curl_slist_append(lStack_30,"Transfer-Encoding: chunked");
      if (lStack_30 == 0) {
        curl_mfprintf(_stderr,"curl_slist_append() failed\n");
        curl_easy_cleanup(lVar2);
        curl_global_cleanup();
        URL_local._4_4_ = 0x7e;
      }
      else {
        slist._4_4_ = curl_easy_setopt(lVar2,0x2712,URL);
        if ((((slist._4_4_ == 0) && (slist._4_4_ = curl_easy_setopt(lVar2,0x2f,1), slist._4_4_ == 0)
             ) && (slist._4_4_ = curl_easy_setopt(lVar2,0x4e2c,read_callback), slist._4_4_ == 0)) &&
           (((slist._4_4_ = curl_easy_setopt(lVar2,0x2719,&local_34), slist._4_4_ == 0 &&
             (slist._4_4_ = curl_easy_setopt(lVar2,0x29,1), slist._4_4_ == 0)) &&
            ((slist._4_4_ = curl_easy_setopt(lVar2,0x2a,1), slist._4_4_ == 0 &&
             (slist._4_4_ = curl_easy_setopt(lVar2,0x2727,lStack_30), slist._4_4_ == 0)))))) {
          slist._4_4_ = curl_easy_perform(lVar2);
        }
        if (lStack_30 != 0) {
          curl_slist_free_all(lStack_30);
        }
        curl_easy_cleanup(lVar2);
        curl_global_cleanup();
        URL_local._4_4_ = slist._4_4_;
      }
    }
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res = CURLE_OK;
  struct curl_slist *slist = NULL;
  struct WriteThis pooh;
  pooh.counter = 0;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  slist = curl_slist_append(slist, "Transfer-Encoding: chunked");
  if(slist == NULL) {
    fprintf(stderr, "curl_slist_append() failed\n");
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  /* First set the URL that is about to receive our POST. */
  test_setopt(curl, CURLOPT_URL, URL);

  /* Now specify we want to POST data */
  test_setopt(curl, CURLOPT_POST, 1L);

#ifdef CURL_DOES_CONVERSIONS
  /* Convert the POST data to ASCII */
  test_setopt(curl, CURLOPT_TRANSFERTEXT, 1L);
#endif

  /* we want to use our own read function */
  test_setopt(curl, CURLOPT_READFUNCTION, read_callback);

  /* pointer to pass to our read function */
  test_setopt(curl, CURLOPT_READDATA, &pooh);

  /* get verbose debug output please */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(curl, CURLOPT_HEADER, 1L);

  /* enforce chunked transfer by setting the header */
  test_setopt(curl, CURLOPT_HTTPHEADER, slist);

#ifdef LIB565
  test_setopt(curl, CURLOPT_HTTPAUTH, (long)CURLAUTH_DIGEST);
  test_setopt(curl, CURLOPT_USERPWD, "foo:bar");
#endif

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

test_cleanup:

  /* clean up the headers list */
  if(slist)
    curl_slist_free_all(slist);

  /* always cleanup */
  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}